

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O0

char * uo_json_find_end(char *json)

{
  char cVar1;
  ushort **ppuVar2;
  char *local_18;
  char *json_local;
  
  local_18 = json;
  while( true ) {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)*local_18] & 0x2000) == 0) break;
    local_18 = local_18 + 1;
  }
  cVar1 = *local_18;
  if (cVar1 == '\0') {
    json_local = (char *)0x0;
  }
  else if (cVar1 == '\"') {
    json_local = uo_json_find_str_end(local_18);
  }
  else if (cVar1 == '[') {
    json_local = uo_json_find_arr_end(local_18);
  }
  else if (cVar1 == 'f') {
    json_local = local_18 + 5;
  }
  else if (cVar1 == 'n') {
    json_local = local_18 + 4;
  }
  else if (cVar1 == 't') {
    json_local = local_18 + 4;
  }
  else if (cVar1 == '{') {
    json_local = uo_json_find_obj_end(local_18);
  }
  else {
    json_local = uo_json_find_num_end(local_18);
  }
  return json_local;
}

Assistant:

char *uo_json_find_end(
    const char *json)
{
    while (isspace(*json))
        ++json;

    switch (*json)
    {
        case '\0': return NULL;
        case '{':  return uo_json_find_obj_end(json);
        case '[':  return uo_json_find_arr_end(json);
        case '"':  return uo_json_find_str_end(json);
        case 'n':  return (char *)json + UO_STRLEN("null");
        case 't':  return (char *)json + UO_STRLEN("true");
        case 'f':  return (char *)json + UO_STRLEN("false");
        default:   return uo_json_find_num_end(json);
    }
}